

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

fio_str_info_s * fiobj_data_read(fio_str_info_s *__return_storage_ptr__,FIOBJ io,intptr_t length)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  stat stat;
  stat sStack_b8;
  
  if (((io == 0) || ((~(uint)io & 6) == 0 || (io & 1) != 0)) ||
     (*(char *)(io & 0xfffffffffffffff8) != '+')) {
    piVar4 = __errno_location();
    *piVar4 = 0xe;
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0;
    if (*(int *)(io + 0x30) == -2) {
      uVar1 = *(ulong *)(io + 0x20);
      lVar2 = *(long *)(io + 0x28);
      if (uVar1 - lVar2 != 0) {
        lVar7 = uVar1 - lVar2;
        if (0 < length) {
          lVar7 = 0;
        }
        if (0 < lVar7 + length) {
          uVar8 = lVar7 + length + lVar2;
          if (uVar1 <= uVar8) {
            uVar8 = uVar1;
          }
          *(ulong *)(io + 0x28) = uVar8;
          fiobj_data_pread(__return_storage_ptr__,*(FIOBJ *)(io + 0x10),lVar2 + *(long *)(io + 0x18)
                           ,uVar8 - lVar2);
          return __return_storage_ptr__;
        }
      }
    }
    else if (*(int *)(io + 0x30) == -1) {
      uVar1 = *(ulong *)(io + 0x20);
      lVar2 = *(long *)(io + 0x28);
      if (uVar1 - lVar2 != 0) {
        lVar7 = uVar1 - lVar2;
        if (0 < length) {
          lVar7 = 0;
        }
        if (0 < lVar7 + length) {
          uVar8 = lVar7 + length + lVar2;
          if (uVar1 <= uVar8) {
            uVar8 = uVar1;
          }
          *(ulong *)(io + 0x28) = uVar8;
          __return_storage_ptr__->capa = 0;
          __return_storage_ptr__->len = uVar8 - lVar2;
          pcVar5 = (char *)(lVar2 + *(long *)(io + 8));
LAB_001408dc:
          __return_storage_ptr__->data = pcVar5;
          return __return_storage_ptr__;
        }
      }
    }
    else {
      do {
        iVar3 = fstat(*(int *)(io + 0x30),&sStack_b8);
        if (iVar3 == 0) goto LAB_00140863;
      } while (*piVar4 == 4);
      sStack_b8.st_size = -1;
LAB_00140863:
      if (length < 1) {
        length = (sStack_b8.st_size + length) - *(long *)(io + 0x10);
      }
      if (length < 1) {
        *piVar4 = 0;
      }
      else {
        lVar2 = *(long *)(io + 0x28);
        uVar1 = lVar2 + length;
        if (uVar1 <= *(ulong *)(io + 0x20)) {
          __return_storage_ptr__->capa = 0;
          __return_storage_ptr__->len = length;
          __return_storage_ptr__->data = (char *)(lVar2 + *(long *)(io + 8));
          *(ulong *)(io + 0x28) = uVar1;
          *(long *)(io + 0x10) = *(long *)(io + 0x10) + length;
          return __return_storage_ptr__;
        }
        *(undefined8 *)(io + 0x20) = 0;
        *(undefined8 *)(io + 0x28) = 0;
        fiobj_data_pre_write(io,length);
        do {
          sVar6 = pread(*(int *)(io + 0x30),*(void **)(io + 8),length,*(__off_t *)(io + 0x10));
          if (sVar6 != 0xffffffffffffffff) break;
        } while (*piVar4 == 4);
        if (1 < sVar6 + 1) {
          *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar6;
          __return_storage_ptr__->capa = 0;
          __return_storage_ptr__->len = sVar6;
          pcVar5 = *(char **)(io + 8);
          goto LAB_001408dc;
        }
      }
    }
  }
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_read(FIOBJ io, intptr_t length) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){.data = NULL, .len = 0};
  }
  errno = 0;
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_read_str(io, length);
    break;
  case -2:
    return fiobj_data_read_slice(io, length);
    break;
  default:
    return fiobj_data_read_file(io, length);
  }
}